

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O0

void __thiscall xe::TestCaseResultData::~TestCaseResultData(TestCaseResultData *this)

{
  TestCaseResultData *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->m_data);
  std::__cxx11::string::~string((string *)&this->m_statusDetails);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TestCaseResultData::~TestCaseResultData (void)
{
}